

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long *plVar5;
  long *__s;
  ostream *poVar6;
  pointer pRVar7;
  ImageOutput local_3a0 [3];
  undefined1 local_340 [8];
  ImageInput input;
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> local_278 [4];
  Mat local_218 [96];
  undefined1 local_1b8 [8];
  HumanDetector detect;
  Mat sampleImage;
  IReaderWriter *local_d8 [2];
  IReaderWriter local_c8 [2];
  undefined1 local_b8 [8];
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> found;
  long local_90;
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> local_88;
  pointer local_70;
  undefined1 auStack_68 [8];
  ImageOutput output;
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> optimized;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Running demo for human detection",0x20);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
  std::ostream::put(-0x20);
  std::ostream::flush();
  plVar5 = (long *)operator_new(8);
  *plVar5 = (long)&PTR_read_001069e0;
  __s = (long *)operator_new(0xd0);
  memset(__s,0,0xd0);
  *__s = (long)&PTR_detect_00106960;
  cv::HOGDescriptor::HOGDescriptor((HOGDescriptor *)(__s + 1));
  detect.descriptor = (IDescriptor *)0x0;
  detect.boundary.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  detect.boundary.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  cv::Mat::Mat((Mat *)&detect.boundary.
                       super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  local_1b8 = (undefined1  [8])(*(long *)(*__s + -0x20) + (long)__s);
  cv::Mat::Mat((Mat *)local_340);
  input._88_8_ = *(long *)(*plVar5 + -0x30) + (long)plVar5;
  std::__cxx11::string::string((string *)local_d8,argv[1],(allocator *)auStack_68);
  ImageInput::readImage((ImageInput *)&detect.field_0x78,(string *)local_340);
  if (local_d8[0] != local_c8) {
    operator_delete(local_d8[0],(long)local_c8[0]._vptr_IReaderWriter + 1);
  }
  cv::Mat::Mat((Mat *)&input.reader,(Mat *)&detect.field_0x78);
  HumanDetector::detectHuman
            ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)local_b8,
             (HumanDetector *)local_1b8,(Mat *)&input.reader);
  cv::Mat::~Mat((Mat *)&input.reader);
  std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::vector
            ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)
             &found.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)local_b8);
  HumanDetector::improveBoundary
            ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)&output.writer,
             (HumanDetector *)local_1b8,
             (vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)
             &found.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  if (found.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(found.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,
                    local_90 -
                    (long)found.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  auStack_68 = (undefined1  [8])0x0;
  output.boundary.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  output.boundary.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  output.boundary.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)((long)plVar5 + *(long *)(*plVar5 + -0x30));
  cv::Mat::Mat((Mat *)local_278,(Mat *)&detect.field_0x78);
  std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::vector
            (&local_88,(vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)&output.writer);
  ImageOutput::drawBoundary(local_3a0,(Mat *)auStack_68,local_278);
  cv::Mat::~Mat((Mat *)local_3a0);
  if (local_88.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.
                          super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.
                          super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  cv::Mat::~Mat((Mat *)local_278);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Press any key to exit view",0x1a);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
  std::ostream::put(-0x20);
  std::ostream::flush();
  cv::Mat::Mat(local_218,(Mat *)&detect.field_0x78);
  ImageOutput::showImage((ImageOutput *)auStack_68,local_218);
  cv::Mat::~Mat(local_218);
  cv::waitKey(0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Real world coordinates of human are:",0x24);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
  std::ostream::put(-0x20);
  std::ostream::flush();
  local_70 = optimized.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
             super__Vector_impl_data._M_start;
  pRVar7 = (pointer)output.writer;
  if ((pointer)output.writer !=
      optimized.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
      super__Vector_impl_data._M_start) {
    do {
      iVar1 = pRVar7->x;
      iVar2 = pRVar7->y;
      iVar3 = pRVar7->width;
      iVar4 = pRVar7->height;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(x, y) = (",10);
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"of height",9);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"and width ",10);
      plVar5 = (long *)std::ostream::operator<<(poVar6,iVar3);
      std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
      std::ostream::put((char)plVar5);
      std::ostream::flush();
      pRVar7 = pRVar7 + 1;
    } while (pRVar7 != local_70);
  }
  if (auStack_68 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_68,
                    (long)output.boundary.
                          super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)auStack_68);
  }
  if (output.writer != (IReaderWriter *)0x0) {
    operator_delete(output.writer,
                    (long)optimized.
                          super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)output.writer);
  }
  if (local_b8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_b8,
                    (long)found.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)local_b8);
  }
  cv::Mat::~Mat((Mat *)&detect.field_0x78);
  cv::Mat::~Mat((Mat *)local_340);
  cv::Mat::~Mat((Mat *)&detect.boundary.
                        super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl
                        .super__Vector_impl_data._M_end_of_storage);
  if (detect.descriptor != (IDescriptor *)0x0) {
    operator_delete(detect.descriptor,
                    (long)detect.boundary.
                          super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)detect.descriptor);
  }
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  std::cout << "Running demo for human detection" << std::endl;
  auto readerWriter = new ReaderWriter();
  auto des = new Descriptor();
  HumanDetector detect;
  detect.setDescriptor(des);  // set actual implementation
  ImageInput input;
  input.setReader(readerWriter);  // set actual implementation
  cv::Mat sampleImage = input.readImage(argv[1]);  // take file name from user
  std::vector<cv::Rect> found = detect.detectHuman(sampleImage);
  std::vector<cv::Rect> optimized = detect.improveBoundary(found);
  ImageOutput output;
  output.setWriter(readerWriter);  // set actual implementation
  output.drawBoundary(sampleImage, optimized);
  std::cout << "Press any key to exit view" << std::endl;
  output.showImage(sampleImage);
  cv::waitKey();  // press any key to exit view
  std::cout << "Real world coordinates of human are:" << std::endl;
  for (auto i : optimized) {
    std::cout << "(x, y) = (" << i.x << ", " << i.y << ")" << "of height"
        << i.height << "and width " << i.width << std::endl;
  }
  return 0;
}